

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XercesXPath::checkForSelectedAttributes(XercesXPath *this)

{
  XMLSize_t XVar1;
  BaseRefVectorOf<xercesc_4_0::XercesStep> *this_00;
  XercesLocationPath *pXVar2;
  XercesStep *pXVar3;
  XPathException *this_01;
  XMLSize_t getAt;
  
  if ((this->fLocationPaths != (RefVectorOf<xercesc_4_0::XercesLocationPath> *)0x0) &&
     (XVar1 = (this->fLocationPaths->super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>).
              fCurCount, XVar1 != 0)) {
    getAt = 0;
    do {
      pXVar2 = BaseRefVectorOf<xercesc_4_0::XercesLocationPath>::elementAt
                         (&this->fLocationPaths->
                           super_BaseRefVectorOf<xercesc_4_0::XercesLocationPath>,getAt);
      this_00 = &pXVar2->fSteps->super_BaseRefVectorOf<xercesc_4_0::XercesStep>;
      if ((this_00 != (BaseRefVectorOf<xercesc_4_0::XercesStep> *)0x0) && (this_00->fCurCount != 0))
      {
        pXVar3 = BaseRefVectorOf<xercesc_4_0::XercesStep>::elementAt(this_00,this_00->fCurCount - 1)
        ;
        if (pXVar3->fAxisType == 2) {
          this_01 = (XPathException *)__cxa_allocate_exception(0x30);
          XPathException::XPathException
                    (this_01,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                     ,0x178,XPath_NoAttrSelector,this->fMemoryManager);
          __cxa_throw(this_01,&XPathException::typeinfo,XMLException::~XMLException);
        }
      }
      getAt = getAt + 1;
    } while (XVar1 != getAt);
  }
  return;
}

Assistant:

void XercesXPath::checkForSelectedAttributes() {

    // verify that an attribute is not selected
    XMLSize_t locSize = (fLocationPaths) ? fLocationPaths->size() : 0;

    for (XMLSize_t i = 0; i < locSize; i++) {

        XercesLocationPath* locPath = fLocationPaths->elementAt(i);
        XMLSize_t stepSize = locPath->getStepSize();

        if (stepSize) {
            if (locPath->getStep(stepSize - 1)->getAxisType() == XercesStep::AxisType_ATTRIBUTE) {
                ThrowXMLwithMemMgr(XPathException, XMLExcepts::XPath_NoAttrSelector, fMemoryManager);
            }
		}
    }
}